

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorBG.cpp
# Opt level: O2

AlphaVector * __thiscall
AlphaVectorBG::BeliefBackupExhaustiveStoreAll
          (AlphaVector *__return_storage_ptr__,AlphaVectorBG *this,JointBeliefInterface *b,Index a,
          GaoVectorSet *G,ValueFunctionPOMDPDiscrete *V)

{
  int *piVar1;
  double dVar2;
  undefined1 auVar3 [16];
  long *plVar4;
  sp_counted_base *psVar5;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *pmVar6;
  bool bVar7;
  int iVar8;
  Index IVar9;
  ulong uVar10;
  ulong uVar11;
  size_t sVar12;
  LIndex i;
  reference pvVar13;
  PlanningUnitMADPDiscrete *this_00;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  VectorSet g_baBeta;
  matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
  bestG_oa1;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  mask;
  JointPolicyPureVector jpol;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  local_140;
  I_PtPDpure_constPtr local_118;
  matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
  local_108;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  local_e0;
  JointPolicyPureVector local_c8;
  
  lVar16 = *(long *)(this->_vptr_AlphaVectorBG[-3] + 8 + (long)&(this->_m_bgip).px);
  if (lVar16 == 0) {
    lVar16 = *(long *)(&this->field_0x18 + (long)this->_vptr_AlphaVectorBG[-3]);
  }
  uVar10 = (**(code **)(**(long **)(lVar16 + 0x30) + 0x68))();
  lVar16 = *(long *)(this->_vptr_AlphaVectorBG[-3] + 8 + (long)&(this->_m_bgip).px);
  if (lVar16 == 0) {
    lVar16 = *(long *)(&this->field_0x18 + (long)this->_vptr_AlphaVectorBG[-3]);
  }
  uVar11 = (**(code **)(**(long **)(lVar16 + 0x30) + 200))();
  this_00 = *(PlanningUnitMADPDiscrete **)
             (this->_vptr_AlphaVectorBG[-3] + 8 + (long)&(this->_m_bgip).px);
  if (this_00 == (PlanningUnitMADPDiscrete *)0x0) {
    this_00 = *(PlanningUnitMADPDiscrete **)
               (&this->field_0x18 + (long)this->_vptr_AlphaVectorBG[-3]);
  }
  sVar12 = PlanningUnitMADPDiscrete::GetNrStates(this_00);
  lVar16 = *(long *)(this->_vptr_AlphaVectorBG[-3] + 8 + (long)&(this->_m_bgip).px);
  if (lVar16 == 0) {
    lVar16 = *(long *)(&this->field_0x18 + (long)this->_vptr_AlphaVectorBG[-3]);
  }
  plVar4 = *(long **)(lVar16 + 0x330);
  uVar17 = (**(code **)(*(long *)((long)plVar4 + *(long *)(*plVar4 + -0xb0)) + 0x70))
                     ((long)plVar4 + *(long *)(*plVar4 + -0xb0));
  GetMask(&local_e0,this,V);
  boost::numeric::ublas::
  matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
  ::matrix(&local_108,uVar11 & 0xffffffff,uVar10 & 0xffffffff);
  for (uVar14 = 0; uVar14 != (uVar11 & 0xffffffff); uVar14 = uVar14 + 1) {
    for (uVar15 = 0; uVar15 != (uVar10 & 0xffffffff); uVar15 = uVar15 + 1) {
      iVar8 = BeliefValue::GetMaximizingVectorIndex
                        ((BeliefInterface *)(&b->field_0x0 + *(long *)((long)*b + -0xb8)),
                         (G->
                         super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                         ).
                         super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                         .base_[(G->
                                super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                                ).
                                super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                                .origin_offset_ +
                                (G->
                                super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                                ).
                                super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                                .stride_list_.elems[0] * (ulong)a +
                                (G->
                                super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                                ).
                                super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                                .stride_list_.elems[1] * uVar14],
                         local_e0.
                         super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar15);
      local_108.data_.data_[local_108.size2_ * uVar14 + uVar15] = iVar8;
    }
  }
  local_118.px = (element_type *)(this->_m_bgip).px;
  local_118.pn.pi_ = (this->_m_bgip).pn.pi_;
  psVar5 = (this->_m_bgip).pn.pi_;
  if (psVar5 != (sp_counted_base *)0x0) {
    LOCK();
    piVar1 = &psVar5->use_count_;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  JointPolicyPureVector::JointPolicyPureVector(&local_c8,&local_118);
  boost::detail::shared_count::~shared_count(&local_118.pn);
  i = BayesianGameBase::GetNrJointPolicies((BayesianGameBase *)(this->_m_bgip).px);
  IVar9 = Globals::CastLIndexToIndex(i);
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::matrix(&local_140,(ulong)IVar9,sVar12 & 0xffffffff);
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::clear(&local_140);
  lVar16 = 0;
  bVar7 = false;
  while (bVar7 == false) {
    for (uVar10 = 0; uVar10 != (uVar11 & 0xffffffff); uVar10 = uVar10 + 1) {
      for (uVar14 = 0; (sVar12 & 0xffffffff) != uVar14; uVar14 = uVar14 + 1) {
        IVar9 = JPolComponent_VectorImplementation::GetJointActionIndex
                          (&local_c8.super_JPolComponent_VectorImplementation,(Index)uVar10);
        if ((long)local_108.data_.data_[local_108.size2_ * uVar10 + (ulong)IVar9] != -1) {
          pmVar6 = (G->
                   super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                   ).
                   super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                   .base_[(G->
                          super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                          ).
                          super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                          .origin_offset_ +
                          (G->
                          super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                          ).
                          super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                          .stride_list_.elems[0] * (ulong)a +
                          (G->
                          super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                          ).
                          super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                          .stride_list_.elems[1] * uVar10];
          *(double *)((long)local_140.data_.data_ + uVar14 * 8 + local_140.size2_ * lVar16) =
               (pmVar6->data_).data_
               [(long)local_108.data_.data_[local_108.size2_ * uVar10 + (ulong)IVar9] *
                pmVar6->size2_ + uVar14] +
               *(double *)((long)local_140.data_.data_ + uVar14 * 8 + local_140.size2_ * lVar16);
        }
      }
    }
    lVar16 = lVar16 + 8;
    bVar7 = JPolComponent_VectorImplementation::Increment
                      (&local_c8.super_JPolComponent_VectorImplementation);
  }
  iVar8 = BeliefValue::GetMaximizingVectorIndex
                    ((BeliefInterface *)(&b->field_0x0 + *(long *)((long)*b + -0xb8)),&local_140);
  AlphaVector::AlphaVector(__return_storage_ptr__,sVar12 & 0xffffffff);
  __return_storage_ptr__->_m_action = a;
  AlphaVector::SetBetaI(__return_storage_ptr__,(long)iVar8);
  uVar10 = 0;
  while ((sVar12 & 0xffffffff) != uVar10) {
    lVar16 = *(long *)(this->_vptr_AlphaVectorBG[-3] + 8 + (long)&(this->_m_bgip).px);
    if (lVar16 == 0) {
      lVar16 = *(long *)(&this->field_0x18 + (long)this->_vptr_AlphaVectorBG[-3]);
    }
    auVar18._0_8_ =
         (**(code **)(**(long **)(lVar16 + 0x330) + 0xc0))
                   (*(long **)(lVar16 + 0x330),uVar10 & 0xffffffff,a);
    IVar9 = Globals::CastLIndexToIndex((long)iVar8);
    dVar2 = local_140.data_.data_[IVar9 * local_140.size2_ + uVar10];
    pvVar13 = std::vector<double,_std::allocator<double>_>::at
                        (&__return_storage_ptr__->_m_values,uVar10);
    auVar18._8_8_ = 0;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = dVar2;
    uVar10 = uVar10 + 1;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar17;
    auVar3 = vfmadd132sd_fma(auVar19,auVar18,auVar3);
    *pvVar13 = auVar3._0_8_;
  }
  boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::~unbounded_array
            (&local_140.data_);
  JointPolicyPureVector::~JointPolicyPureVector(&local_c8);
  boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>::~unbounded_array
            (&local_108.data_);
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector(&local_e0);
  return __return_storage_ptr__;
}

Assistant:

AlphaVector
AlphaVectorBG::BeliefBackupExhaustiveStoreAll(const JointBeliefInterface &b,
                                              Index a,
                                              const GaoVectorSet &G,
                                              const 
                                              ValueFunctionPOMDPDiscrete &V)
    const
{
    // Equation numbers refer to PWLC_Dec-POMDPs_b.ps of Nov 7

    unsigned int nrA=GetPU()->GetNrJointActions(),
        nrO=GetPU()->GetNrJointObservations(),
        nrS=GetPU()->GetNrStates();
    double gamma=GetPU()->GetDiscount();

    // the mask selects which vectors to consider:
    // mask[jaI][vI] is true <-> vector vI specifies action jaI
    vector<vector<bool> > mask=GetMask(V);

    // given a particular \beta
    //  for all o,   g*_bao\beta = arg max_g^va'_ao \sum_s g^va'_ao(s) * b(s)
    //
    // i.e., we select the g^va'_ao from a set consistent with \beta
    //  (which means that \beta(o) = a') that maximizes the current belief.
    //
    // In this code, however, we do something slightly different namely:
    //
    //  for all o, forall a' 
    //      g*_baoa' =  arg max_g^va'_ao \sum_s g^va'_ao(s) * b(s)
    //
    // I.e., we select the maximizing vector for each possible a'.
    // we store this in bestG_oa1[o][a'].
    boost::numeric::ublas::matrix<int> bestG_oa1(nrO,nrA);

    // (14)
    for(unsigned int o=0;o!=nrO;o++)
        for(unsigned int a1=0;a1!=nrA;++a1)
            bestG_oa1(o,a1)=BeliefValue::GetMaximizingVectorIndex(b,*G[a][o],
                                                                  mask[a1]);

    // now we create a jpol for the induced Bayesian game
    // (i.e. \beta mentioned above, is the policy for a Bayesian game)
    // and use that to combine the bestG_oa1 to g_a-vectors:
    //  g_ba\beta = \sum_o bestG_oa1[o][ \beta(o) ]
    JointPolicyPureVector jpol(_m_bgip);
    Index a1;
    bool round=false;

    VectorSet g_baBeta(CastLIndexToIndex(_m_bgip->GetNrJointPolicies()),nrS);
    g_baBeta.clear();
    int k=-1;

    // (16)
    while (!round) // i.e. forall \beta
    {
        k++;
        for(unsigned int o=0;o!=nrO;o++)
            for(unsigned int s=0;s!=nrS;++s)
            {
                a1=jpol.GetJointActionIndex(o);
                /* following code implements:
                 * VectorSet V=*G[a][o];
                 * int i=bestG_oa1(o,a1);
                 * g_baBeta(k,s)+=V(i,s); // +=V[i][s]; */
                 if(bestG_oa1(o,a1)!=-1)
                     g_baBeta(k,s)+=(*G[a][o])(bestG_oa1(o,a1),s);
            }
        round = ++(jpol);
    }

    AlphaVector::BGPolicyIndex betaMaxI=
        BeliefValue::GetMaximizingVectorIndex(b,g_baBeta);

    double x;
    // create the aplha-vector for b (i.e. add immediate reward)
    AlphaVector newVector(nrS);
    newVector.SetAction(a);
    newVector.SetBetaI(betaMaxI);
    for(unsigned int s=0;s!=nrS;s++)
    {
        // (19)
        x=GetPU()->GetReward(s,a)+gamma*g_baBeta(CastLIndexToIndex(betaMaxI),s);
        newVector.SetValue(x,s);
    }

    return(newVector);
}